

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_const_char_*,_const_char_*>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*const,char_const*,char_const*const>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_const_char_*,_const_char_*>
           *__return_storage_ptr__,v10 *this,char **args,char **args_1,char **args_2)

{
  char *pcVar1;
  char *pcVar2;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  size_t local_d0;
  char **args_local_2;
  char **args_local_1;
  char **args_local;
  size_t local_30;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  
  pcVar1 = *args;
  pcVar2 = *args_1;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = *(longlong *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_30;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = pcVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_d0;
  (__return_storage_ptr__->data_).args_[2].field_0.string.data = pcVar2;
  (__return_storage_ptr__->data_).args_[2].field_0.custom.format =
       (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v10::appender,_char>_ptr *)
       args_local_1;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}